

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

int google::protobuf::CEscapeInternal
              (char *src,int src_len,char *dest,int dest_len,bool use_hex,bool utf8_safe)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  char *__format;
  byte *pbVar6;
  int iVar7;
  
  if (src_len < 1) {
    iVar7 = 0;
  }
  else {
    pbVar6 = (byte *)(src + src_len);
    __format = "\\%03o";
    if (use_hex) {
      __format = "\\x%02x";
    }
    bVar4 = 0;
    iVar7 = 0;
    do {
      if (dest_len - iVar7 < 2) {
        return -1;
      }
      bVar1 = *src;
      uVar5 = (uint)bVar1;
      if (uVar5 < 0x22) {
        if (bVar1 == 9) {
          (dest + iVar7)[0] = '\\';
          (dest + iVar7)[1] = 't';
          goto LAB_0037b838;
        }
        if (bVar1 == 10) {
          (dest + iVar7)[0] = '\\';
          (dest + iVar7)[1] = 'n';
          goto LAB_0037b838;
        }
        if (bVar1 == 0xd) {
          (dest + iVar7)[0] = '\\';
          (dest + iVar7)[1] = 'r';
          goto LAB_0037b838;
        }
LAB_0037b80c:
        if (((char)bVar1 < '\0' && utf8_safe) ||
           (((byte)(bVar1 - 0x20) < 0x5f &&
            (((bVar4 & 1) == 0 ||
             ((9 < (byte)(bVar1 - 0x30) &&
              ((0x25 < uVar5 - 0x41 || ((0x3f0000003fU >> ((ulong)(uVar5 - 0x41) & 0x3f) & 1) == 0))
              )))))))) {
          lVar3 = (long)iVar7;
          iVar7 = iVar7 + 1;
          dest[lVar3] = bVar1;
          goto LAB_0037b83c;
        }
        if ((uint)(dest_len - iVar7) < 4) {
          return -1;
        }
        sprintf(dest + iVar7,__format);
        iVar7 = iVar7 + 4;
        bVar4 = use_hex;
      }
      else {
        if (uVar5 == 0x22) {
          (dest + iVar7)[0] = '\\';
          (dest + iVar7)[1] = '\"';
        }
        else if (bVar1 == 0x27) {
          (dest + iVar7)[0] = '\\';
          (dest + iVar7)[1] = '\'';
        }
        else {
          if (bVar1 != 0x5c) goto LAB_0037b80c;
          (dest + iVar7)[0] = '\\';
          (dest + iVar7)[1] = '\\';
        }
LAB_0037b838:
        iVar7 = iVar7 + 2;
LAB_0037b83c:
        bVar4 = 0;
      }
      src = (char *)((byte *)src + 1);
    } while (src < pbVar6);
  }
  iVar2 = -1;
  if (iVar7 < dest_len) {
    dest[iVar7] = '\0';
    iVar2 = iVar7;
  }
  return iVar2;
}

Assistant:

int CEscapeInternal(const char* src, int src_len, char* dest,
                    int dest_len, bool use_hex, bool utf8_safe) {
  const char* src_end = src + src_len;
  int used = 0;
  bool last_hex_escape = false; // true if last output char was \xNN

  for (; src < src_end; src++) {
    if (dest_len - used < 2)   // Need space for two letter escape
      return -1;

    bool is_hex_escape = false;
    switch (*src) {
      case '\n': dest[used++] = '\\'; dest[used++] = 'n';  break;
      case '\r': dest[used++] = '\\'; dest[used++] = 'r';  break;
      case '\t': dest[used++] = '\\'; dest[used++] = 't';  break;
      case '\"': dest[used++] = '\\'; dest[used++] = '\"'; break;
      case '\'': dest[used++] = '\\'; dest[used++] = '\''; break;
      case '\\': dest[used++] = '\\'; dest[used++] = '\\'; break;
      default:
        // Note that if we emit \xNN and the src character after that is a hex
        // digit then that digit must be escaped too to prevent it being
        // interpreted as part of the character code by C.
        if ((!utf8_safe || static_cast<uint8>(*src) < 0x80) &&
            (!isprint(*src) ||
             (last_hex_escape && isxdigit(*src)))) {
          if (dest_len - used < 4) // need space for 4 letter escape
            return -1;
          sprintf(dest + used, (use_hex ? "\\x%02x" : "\\%03o"),
                  static_cast<uint8>(*src));
          is_hex_escape = use_hex;
          used += 4;
        } else {
          dest[used++] = *src; break;
        }
    }
    last_hex_escape = is_hex_escape;
  }

  if (dest_len - used < 1)   // make sure that there is room for \0
    return -1;

  dest[used] = '\0';   // doesn't count towards return value though
  return used;
}